

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
mpt::reference<mpt::layout::graph::data>::reference
          (reference<mpt::layout::graph::data> *this,reference<mpt::layout::graph::data> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  data *pdVar2;
  
  this->_ref = (data *)0x0;
  pdVar2 = ref->_ref;
  if (pdVar2 != (data *)0x0) {
    iVar1 = (*pdVar2->_vptr_data[1])(pdVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      pdVar2 = (data *)0x0;
    }
    if (this->_ref != (data *)0x0) {
      (**this->_ref->_vptr_data)();
    }
    this->_ref = pdVar2;
  }
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}